

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentPtr::CompareComponent(ON_SubDComponentPtr *a,ON_SubDComponentPtr *b)

{
  ulong uVar1;
  ulong uVar2;
  ON__UINT_PTR y;
  ON__UINT_PTR x;
  int rc;
  ON_SubDComponentPtr *b_local;
  ON_SubDComponentPtr *a_local;
  
  a_local._4_4_ = CompareType(a,b);
  if ((a_local._4_4_ == 0) && (a != b)) {
    uVar1 = a->m_ptr & 0xfffffffffffffff8;
    uVar2 = b->m_ptr & 0xfffffffffffffff8;
    if (uVar1 < uVar2) {
      a_local._4_4_ = -1;
    }
    else if (uVar2 < uVar1) {
      a_local._4_4_ = 1;
    }
  }
  return a_local._4_4_;
}

Assistant:

int ON_SubDComponentPtr::CompareComponent(
  const ON_SubDComponentPtr* a,
  const ON_SubDComponentPtr* b
)
{
  const int rc = ON_SubDComponentPtr::CompareType(a, b);
  if (0 == rc && a != b)
  {
    // 0 == ON_SubDComponentPtr::CompareType(a, b) and a != b insures both pointers are not nullptr.
    const ON__UINT_PTR x = (a->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
    const ON__UINT_PTR y = (b->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
    if (x < y)
      return -1;
    if (x > y)
      return 1;
  }
  return rc;
}